

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i xy_y_convolve_6tap_2x2_sse2(int16_t *src,__m128i *s_32,__m128i *ss_128,__m128i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  longlong lVar3;
  uint uVar4;
  __m128i *in_RCX;
  __m128i *in_RDX;
  long in_RSI;
  long in_RDI;
  __m128i alVar5;
  __m128i r;
  __m128i src56;
  __m128i src45;
  ulong local_a8;
  ulong local_88;
  
  uVar4 = loadu_int32((void *)(in_RDI + 0x14));
  local_88 = (ulong)uVar4;
  *(ulong *)(in_RSI + 0x50) = local_88;
  *(undefined8 *)(in_RSI + 0x58) = 0;
  auVar1 = vpunpckldq_avx(*(undefined1 (*) [16])(in_RSI + 0x40),
                          *(undefined1 (*) [16])(in_RSI + 0x50));
  uVar4 = loadu_int32((void *)(in_RDI + 0x18));
  local_a8 = (ulong)uVar4;
  *(ulong *)(in_RSI + 0x40) = local_a8;
  *(undefined8 *)(in_RSI + 0x48) = 0;
  auVar2 = vpunpckldq_avx(*(undefined1 (*) [16])(in_RSI + 0x50),
                          *(undefined1 (*) [16])(in_RSI + 0x40));
  alVar5 = (__m128i)vpunpcklwd_avx(auVar1,auVar2);
  in_RDX[2] = alVar5;
  alVar5 = convolve16_6tap_sse2(in_RDX,in_RCX);
  lVar3 = in_RDX[1][1];
  (*in_RDX)[0] = in_RDX[1][0];
  (*in_RDX)[1] = lVar3;
  lVar3 = in_RDX[2][1];
  in_RDX[1][0] = in_RDX[2][0];
  in_RDX[1][1] = lVar3;
  alVar5[0] = (longlong)in_RDX;
  return alVar5;
}

Assistant:

static inline __m128i xy_y_convolve_6tap_2x2_sse2(const int16_t *const src,
                                                  __m128i s_32[6],
                                                  __m128i ss_128[3],
                                                  const __m128i coeffs[3]) {
  s_32[5] = _mm_cvtsi32_si128(loadu_int32(src + 5 * 2));
  const __m128i src45 = _mm_unpacklo_epi32(s_32[4], s_32[5]);
  s_32[4] = _mm_cvtsi32_si128(loadu_int32(src + 6 * 2));
  const __m128i src56 = _mm_unpacklo_epi32(s_32[5], s_32[4]);
  ss_128[2] = _mm_unpacklo_epi16(src45, src56);
  const __m128i r = convolve16_6tap_sse2(ss_128, coeffs);
  ss_128[0] = ss_128[1];
  ss_128[1] = ss_128[2];
  return r;
}